

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O3

void tcg_out_cmp(TCGContext_conflict9 *s,TCGArg arg1,TCGArg arg2,int const_arg2,int rexw)

{
  byte *pbVar1;
  byte bVar2;
  int r;
  
  r = (int)arg1;
  bVar2 = (byte)arg1;
  if (const_arg2 == 0) {
    tcg_out_opc(s,(rexw + 7U & 0xfffffff8) + (rexw + 7U & 7) * 8 + 3,r,(int)arg2,0);
    bVar2 = ((byte)arg2 & 7) + bVar2 * '\b';
  }
  else {
    if (arg2 != 0) {
      tgen_arithi(s,rexw + 7,r,arg2,0);
      return;
    }
    tcg_out_opc(s,rexw + 0x85,r,r,0);
    bVar2 = (bVar2 & 7) + bVar2 * '\b';
  }
  pbVar1 = s->code_ptr;
  s->code_ptr = pbVar1 + 1;
  *pbVar1 = bVar2 | 0xc0;
  return;
}

Assistant:

static void tcg_out_cmp(TCGContext *s, TCGArg arg1, TCGArg arg2,
                        int const_arg2, int rexw)
{
    if (const_arg2) {
        if (arg2 == 0) {
            /* test r, r */
            tcg_out_modrm(s, OPC_TESTL + rexw, arg1, arg1);
        } else {
            tgen_arithi(s, ARITH_CMP + rexw, arg1, arg2, 0);
        }
    } else {
        tgen_arithr(s, ARITH_CMP + rexw, arg1, arg2);
    }
}